

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O0

void draw_right_arrow(int left,int top,int width,int height,Am_Widget_Look look,bool depressed,
                     bool active,Computed_Colors_Record *color_rec,Am_Drawonable *draw)

{
  uint uVar1;
  am_rect arrow_rect_00;
  am_rect arrow_rect_01;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  undefined4 uVar8;
  Am_Style *local_e0;
  Am_Style *local_d8;
  Am_Style *local_d0;
  Am_Style *local_c8;
  Am_Style *local_c0;
  Am_Style local_a8;
  Am_Style fill_style;
  int local_90;
  int local_8c;
  int x;
  int a_height;
  int a_width;
  int a_left;
  int a_top;
  int bottom;
  int right;
  int center_y;
  Am_Style line2;
  Am_Style local_48;
  Am_Style line1;
  Am_Style fill1;
  am_rect arrow_rect;
  bool active_local;
  bool depressed_local;
  int height_local;
  int width_local;
  int top_local;
  int left_local;
  Am_Widget_Look look_local;
  
  am_rect::am_rect((am_rect *)&fill1,left,top,width,height);
  if (look.value == Am_MOTIF_LOOK_val) {
    if (depressed) {
      local_c0 = &color_rec->data->background_style;
    }
    else {
      local_c0 = &color_rec->data->foreground_style;
    }
    Am_Style::Am_Style(&line1,local_c0);
    if (depressed) {
      local_c8 = &color_rec->data->shadow_style;
    }
    else {
      local_c8 = &color_rec->data->highlight_style;
    }
    Am_Style::Am_Style(&local_48,local_c8);
    if (depressed) {
      local_d0 = &color_rec->data->highlight_style;
    }
    else {
      local_d0 = &color_rec->data->shadow_style;
    }
    Am_Style::Am_Style((Am_Style *)&right,local_d0);
    uVar2 = top + height / 2;
    uVar5 = left + -1 + width;
    uVar1 = top + -1 + height;
    (*draw->_vptr_Am_Drawonable[0x2a])
              (draw,&local_48,&Am_No_Style,(ulong)(uint)left,(ulong)uVar1,(ulong)(uint)left,top + 1,
               uVar5,uVar2,0);
    (*draw->_vptr_Am_Drawonable[0x28])
              (draw,&right,(ulong)(uint)left,(ulong)uVar1,(ulong)uVar5,(ulong)uVar2,0);
    (*draw->_vptr_Am_Drawonable[0x2a])
              (draw,&local_48,&line1,(ulong)(left + 1),(ulong)(uVar1 - 1),(ulong)(left + 1),top + 2,
               uVar5 - 1,uVar2,0);
    (*draw->_vptr_Am_Drawonable[0x28])
              (draw,&right,(ulong)(left + 1),(ulong)(uVar1 - 1),(ulong)(uVar5 - 1),(ulong)uVar2,0);
    Am_Style::~Am_Style((Am_Style *)&right);
    Am_Style::~Am_Style(&local_48);
    Am_Style::~Am_Style(&line1);
  }
  else if (look.value == Am_WINDOWS_LOOK_val) {
    arrow_rect_01._8_8_ = arrow_rect._0_8_;
    arrow_rect_01._0_8_ = fill1.data;
    draw_win_arrow_box(arrow_rect_01,depressed,false,color_rec,draw);
    a_width = 5;
    if (((depressed ^ 0xffU) & 1) != 0) {
      a_width = 4;
    }
    iVar3 = 7;
    if (((depressed ^ 0xffU) & 1) != 0) {
      iVar3 = 6;
    }
    local_8c = 6;
    for (local_90 = 0; local_90 < 4; local_90 = local_90 + 1) {
      (*draw->_vptr_Am_Drawonable[0x28])
                (draw,&Am_Black,(ulong)(uint)(left + iVar3 + local_90),(ulong)(uint)(top + a_width),
                 (ulong)(uint)(left + iVar3 + local_90),(ulong)(uint)(top + a_width + local_8c),0);
      a_width = a_width + 1;
      local_8c = local_8c + -2;
    }
  }
  else {
    if (look.value != Am_MACINTOSH_LOOK_val) {
      Am_Error("Unknown Look parameter");
    }
    fill_style = fill1;
    arrow_rect_00._8_8_ = arrow_rect._0_8_;
    arrow_rect_00._0_8_ = fill1.data;
    draw_mac_arrow_box(arrow_rect_00,active,color_rec,draw);
    if (active) {
      if (depressed) {
        local_d8 = &Am_Black;
      }
      else {
        local_d8 = &color_rec->data->background_style;
      }
      local_e0 = local_d8;
    }
    else {
      local_e0 = &color_rec->data->foreground_style;
    }
    Am_Style::Am_Style(&local_a8,local_e0);
    uVar5 = left + 7;
    (*draw->_vptr_Am_Drawonable[0x2b])
              (draw,&color_rec->data->shadow_style,&local_a8,(ulong)uVar5,(ulong)(top + 2U),
               (ulong)uVar5,top + 0xc,left + 0xc,top + 7,uVar5,top + 2U,0);
    iVar4 = left + 7;
    iVar6 = left + 3;
    iVar7 = top + 9;
    uVar8 = 0;
    iVar3 = iVar7;
    (*draw->_vptr_Am_Drawonable[0x2b])(draw,&color_rec->data->shadow_style,&local_a8);
    (*draw->_vptr_Am_Drawonable[0x28])
              (draw,&local_a8,(ulong)(left + 7),(ulong)(top + 6),(ulong)(left + 7),(ulong)(top + 8),
               0,iVar6,iVar7,iVar4,iVar3,uVar8);
    Am_Style::~Am_Style(&local_a8);
  }
  return;
}

Assistant:

void
draw_right_arrow(int left, int top, int width, int height, Am_Widget_Look look,
                 bool depressed, bool active,
                 const Computed_Colors_Record &color_rec, Am_Drawonable *draw)
{
  am_rect arrow_rect(left, top, width, height);
  switch (look.value) {
  case Am_MOTIF_LOOK_val: {
    const Am_Style fill1(depressed ? color_rec.data->background_style
                                   : color_rec.data->foreground_style);
    const Am_Style line1(depressed ? color_rec.data->shadow_style
                                   : color_rec.data->highlight_style);
    const Am_Style line2(depressed ? color_rec.data->highlight_style
                                   : color_rec.data->shadow_style);

    int center_y = top + height / 2;
    int right = left + width - 1;
    int bottom = top + height - 1;

    //top line
    draw->Draw_2_Lines(line1, Am_No_Style, left, bottom, left, top + 1, right,
                       center_y);
    //bottom line
    draw->Draw_Line(line2, left, bottom, right, center_y);
    //top line
    draw->Draw_2_Lines(line1, fill1, left + 1, bottom - 1, left + 1, top + 2,
                       right - 1, center_y);
    //bottom line
    draw->Draw_Line(line2, left + 1, bottom - 1, right - 1, center_y);
    break;
  }

  case Am_WINDOWS_LOOK_val: {
    draw_win_arrow_box(arrow_rect, depressed, false, color_rec, draw);

    int a_top = !depressed ? 4 : 5, a_left = !depressed ? 6 : 7, a_width = 4,
        a_height = 6; // actually 7, because of pixel drawing

    for (int x = 0; x < a_width; x++) {
      draw->Draw_Line(Am_Black, left + a_left + x, top + a_top,
                      left + a_left + x, top + a_top + a_height);
      a_top++;
      a_height -= 2;
    }
    break;
  }

  case Am_MACINTOSH_LOOK_val: {
    draw_mac_arrow_box(arrow_rect, active, color_rec, draw);

    Am_Style fill_style =
        (active) ? (!depressed ? color_rec.data->background_style : Am_Black)
                 : color_rec.data->foreground_style;
    draw->Draw_3_Lines(color_rec.data->shadow_style, fill_style, left + 7,
                       top + 2, left + 7, top + 12, left + 12, top + 7,
                       left + 7, top + 2);
    draw->Draw_3_Lines(color_rec.data->shadow_style, fill_style, left + 7,
                       top + 5, left + 3, top + 5, left + 3, top + 9, left + 7,
                       top + 9);
    draw->Draw_Line(fill_style, left + 7, top + 6, left + 7, top + 8);
    break;
  }

  default:
    Am_Error("Unknown Look parameter");
    break;
  }
}